

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DictionarySGL<false,_false>::delete_key(DictionarySGL<false,_false> *this,char *key)

{
  bool bVar1;
  char *in_RSI;
  long in_RDI;
  Query query;
  Query local_30;
  uint32_t local_4;
  
  Query::Query(&local_30,in_RSI);
  std::
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                *)0x159168);
  bVar1 = DaTrie<false,_false,_false>::delete_key((DaTrie<false,_false,_false> *)this,(Query *)key);
  if (bVar1) {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -1;
    local_4 = Query::value(&local_30);
  }
  else {
    local_4 = 0xffffffff;
  }
  Query::~Query(&local_30);
  return local_4;
}

Assistant:

uint32_t delete_key(const char* key) {
    Query query(key);
    if (!trie_->delete_key(query)) {
      return NOT_FOUND;
    }
    --num_keys_;
    return query.value();
  }